

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void set_morale_flag_screen_attributes(tgestate_t *state,attribute_t attrs)

{
  attribute_t *paVar1;
  int iVar2;
  
  paVar1 = (state->speccy->screen).attributes + 0x42;
  iVar2 = -0x13;
  do {
    *paVar1 = attrs;
    paVar1[1] = attrs;
    paVar1[2] = attrs;
    paVar1 = paVar1 + state->width;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  invalidate_attrs(state,(state->speccy->screen).attributes + 0x42,0x18,0x98);
  return;
}

Assistant:

void set_morale_flag_screen_attributes(tgestate_t *state, attribute_t attrs)
{
  attribute_t *pattrs; /* was HL */
  int          iters;  /* was B */

  assert(state != NULL);
  assert(attrs >= attribute_BLUE_OVER_BLACK && attrs <= attribute_BRIGHT_WHITE_OVER_BLACK);

  pattrs = &state->speccy->screen.attributes[morale_flag_attributes_offset];
  iters = 19; /* Height of flag. */
  do
  {
    pattrs[0] = attrs;
    pattrs[1] = attrs;
    pattrs[2] = attrs;
    pattrs += state->width;
  }
  while (--iters);

  /* Conv: Invalidation added over the original game. */
  invalidate_attrs(state,
                   &state->speccy->screen.attributes[morale_flag_attributes_offset],
                   3 * 8, 19 * 8);
}